

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

bool __thiscall
fasttext::FastText::predictLine
          (FastText *this,istream *in,
          vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *predictions,int32_t k,real threshold)

{
  bool bVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RDI;
  undefined4 uVar3;
  double dVar4;
  pair<float,_int> *p;
  iterator __end1;
  iterator __begin1;
  Predictions *__range1;
  Predictions linePredictions;
  vector<int,_std::allocator<int>_> labels;
  vector<int,_std::allocator<int>_> words;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined1 *__n;
  string local_c8 [36];
  undefined4 local_a4;
  reference local_a0;
  pair<float,_int> *local_98;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  local_90;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  real in_stack_ffffffffffffff84;
  Dictionary *in_stack_ffffffffffffff88;
  Dictionary *in_stack_ffffffffffffff90;
  int32_t in_stack_ffffffffffffff9c;
  FastText *in_stack_ffffffffffffffa0;
  undefined1 local_58 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  byte local_1;
  
  local_20 = in_RDX;
  std::
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear((vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)0x185f09);
  iVar2 = std::istream::peek();
  if (iVar2 == -1) {
    local_1 = 0;
  }
  else {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x185f3a);
    __n = local_58;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x185f4c);
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x185f5a);
    Dictionary::getLine(in_stack_ffffffffffffff90,(istream *)in_stack_ffffffffffffff88,
                        (vector<int,_std::allocator<int>_> *)
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff78);
    std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::vector
              ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)0x185f88);
    predict(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
            (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff90,
            (Predictions *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
    this_00 = local_20;
    std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::size
              ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
               &stack0xffffffffffffff80);
    std::
    vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::reserve(in_RDI,(size_type)__n);
    local_90._M_current =
         (pair<float,_int> *)
         std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
                   (in_stack_fffffffffffffef8);
    local_98 = (pair<float,_int> *)
               std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::end
                         (in_stack_fffffffffffffef8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                          *)in_stack_ffffffffffffff00,
                         (__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                          *)in_stack_fffffffffffffef8);
      if (!bVar1) break;
      local_a0 = __gnu_cxx::
                 __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                 ::operator*(&local_90);
      in_stack_ffffffffffffff00 = local_20;
      dVar4 = std::exp((double)(ulong)(uint)local_a0->first);
      uVar3 = SUB84(dVar4,0);
      local_a4 = uVar3;
      std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x186072);
      Dictionary::getLabel_abi_cxx11_(in_stack_ffffffffffffff88,(int32_t)in_stack_ffffffffffffff84);
      std::
      vector<std::pair<float,std::__cxx11::string>,std::allocator<std::pair<float,std::__cxx11::string>>>
      ::emplace_back<float,std::__cxx11::string>
                ((vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this_00,(float *)CONCAT44(uVar3,in_stack_ffffffffffffff08),
                 in_stack_ffffffffffffff00);
      std::__cxx11::string::~string(local_c8);
      __gnu_cxx::
      __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
      ::operator++(&local_90);
    }
    local_1 = 1;
    std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::~vector
              ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)this_00);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool FastText::predictLine(
    std::istream& in,
    std::vector<std::pair<real, std::string>>& predictions,
    int32_t k,
    real threshold) const {
  predictions.clear();
  if (in.peek() == EOF) {
    return false;
  }

  std::vector<int32_t> words, labels;
  dict_->getLine(in, words, labels);
  Predictions linePredictions;
  predict(k, words, linePredictions, threshold);
  predictions.reserve(linePredictions.size());
  for (const auto& p : linePredictions) {
    predictions.emplace_back(std::exp(p.first), dict_->getLabel(p.second));
  }

  return true;
}